

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_parser_extras.h
# Opt level: O2

bool v130_desktop(_mesa_glsl_parse_state *state)

{
  uint uVar1;
  
  uVar1 = state->forced_language_version;
  if (uVar1 == 0) {
    uVar1 = state->language_version;
  }
  return (bool)((state->es_shader ^ 1U) & 0x81 < uVar1);
}

Assistant:

bool is_version(unsigned required_glsl_version,
                   unsigned required_glsl_es_version) const
   {
      unsigned required_version = this->es_shader ?
         required_glsl_es_version : required_glsl_version;
      unsigned this_version = this->forced_language_version
         ? this->forced_language_version : this->language_version;
      return required_version != 0
         && this_version >= required_version;
   }